

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode multi_timeout(Curl_multi *multi,long *timeout_ms)

{
  long lVar1;
  bool bVar2;
  Curl_tree *in_RAX;
  long lVar3;
  long lVar4;
  timeval older;
  timeval newer;
  
  if (multi->timetree == (Curl_tree *)0x0) {
    lVar4 = -1;
  }
  else {
    older = curlx_tvnow();
    lVar3 = older.tv_sec;
    lVar4 = 0;
    in_RAX = Curl_splay((timeval)ZEXT816(0),multi->timetree);
    multi->timetree = in_RAX;
    lVar1 = (in_RAX->key).tv_sec;
    if (lVar3 <= lVar1) {
      lVar4 = (in_RAX->key).tv_usec;
      bVar2 = older.tv_usec < lVar4;
      in_RAX = (Curl_tree *)CONCAT71((int7)((ulong)in_RAX >> 8),bVar2 || lVar3 < lVar1);
      if (bVar2 || lVar3 < lVar1) {
        newer.tv_usec = lVar4;
        newer.tv_sec = lVar1;
        in_RAX = (Curl_tree *)curlx_tvdiff(newer,older);
        lVar4 = (long)&in_RAX->smaller + (ulong)(in_RAX == (Curl_tree *)0x0);
      }
      else {
        lVar4 = 0;
      }
    }
  }
  *timeout_ms = lVar4;
  return (CURLMcode)in_RAX;
}

Assistant:

static CURLMcode multi_timeout(struct Curl_multi *multi,
                               long *timeout_ms)
{
  static struct timeval tv_zero = {0, 0};

  if(multi->timetree) {
    /* we have a tree of expire times */
    struct timeval now = Curl_tvnow();

    /* splay the lowest to the bottom */
    multi->timetree = Curl_splay(tv_zero, multi->timetree);

    if(Curl_splaycomparekeys(multi->timetree->key, now) > 0) {
      /* some time left before expiration */
      *timeout_ms = curlx_tvdiff(multi->timetree->key, now);
      if(!*timeout_ms)
        /*
         * Since we only provide millisecond resolution on the returned value
         * and the diff might be less than one millisecond here, we don't
         * return zero as that may cause short bursts of busyloops on fast
         * processors while the diff is still present but less than one
         * millisecond! instead we return 1 until the time is ripe.
         */
        *timeout_ms=1;
    }
    else
      /* 0 means immediately */
      *timeout_ms = 0;
  }
  else
    *timeout_ms = -1;

  return CURLM_OK;
}